

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1905.c
# Opt level: O0

int test(char *URL)

{
  fd_set *__arr_2;
  uint __i_2;
  fd_set *__arr_1;
  uint __i_1;
  fd_set *__arr;
  undefined1 auStack_1d0 [4];
  uint __i;
  timeval timeout;
  fd_set E;
  fd_set W;
  fd_set R;
  long max_tout;
  int MAX;
  int unfinished;
  CURL *ch;
  CURLSH *sh;
  CURLM *cm;
  char *URL_local;
  
  sh = (CURLSH *)0x0;
  ch = (CURL *)0x0;
  _MAX = 0;
  cm = (CURLM *)URL;
  sh = (CURLSH *)curl_multi_init();
  if (sh == (CURLSH *)0x0) {
    URL_local._4_4_ = 1;
  }
  else {
    ch = (CURL *)curl_share_init();
    if (ch != (CURL *)0x0) {
      curl_share_setopt(ch,1,2);
      curl_share_setopt(ch,1,2);
      _MAX = curl_easy_init();
      if (_MAX != 0) {
        curl_easy_setopt(_MAX,0x2774,ch);
        curl_easy_setopt(_MAX,0x2712,cm);
        curl_easy_setopt(_MAX,0x272f,"log/cookies1905");
        curl_easy_setopt(_MAX,0x2762,"log/cookies1905");
        curl_multi_add_handle(sh,_MAX);
        max_tout._4_4_ = 1;
        while (max_tout._4_4_ != 0) {
          max_tout._0_4_ = 0;
          for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
            W.__fds_bits[(ulong)__arr._4_4_ + 0xf] = 0;
          }
          for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
            E.__fds_bits[(ulong)__arr_1._4_4_ + 0xf] = 0;
          }
          for (__arr_2._4_4_ = 0; __arr_2._4_4_ < 0x10; __arr_2._4_4_ = __arr_2._4_4_ + 1) {
            E.__fds_bits[(ulong)__arr_2._4_4_ - 1] = 0;
          }
          curl_multi_perform(sh,(long)&max_tout + 4);
          curl_multi_fdset(sh,W.__fds_bits + 0xf,E.__fds_bits + 0xf,&timeout.tv_usec,&max_tout);
          curl_multi_timeout(sh,R.__fds_bits + 0xf);
          if (R.__fds_bits[0xf] < 1) {
            _auStack_1d0 = 0;
            timeout.tv_sec = 1000;
          }
          else {
            _auStack_1d0 = R.__fds_bits[0xf] / 1000;
            timeout.tv_sec = (R.__fds_bits[0xf] % 1000) * 1000;
          }
          select((int)max_tout + 1,(fd_set *)(W.__fds_bits + 0xf),(fd_set *)(E.__fds_bits + 0xf),
                 (fd_set *)&timeout.tv_usec,(timeval *)auStack_1d0);
        }
        curl_easy_setopt(_MAX,0x2797,"FLUSH");
        curl_easy_setopt(_MAX,0x2774,0);
        curl_multi_remove_handle(sh,_MAX);
      }
    }
    curl_easy_cleanup(_MAX);
    curl_share_cleanup(ch);
    curl_multi_cleanup(sh);
    curl_global_cleanup();
    URL_local._4_4_ = 0;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLM *cm = NULL;
  CURLSH *sh = NULL;
  CURL *ch = NULL;
  int unfinished;

  cm = curl_multi_init();
  if(!cm)
    return 1;
  sh = curl_share_init();
  if(!sh)
    goto cleanup;

  curl_share_setopt(sh, CURLSHOPT_SHARE, CURL_LOCK_DATA_COOKIE);
  curl_share_setopt(sh, CURLSHOPT_SHARE, CURL_LOCK_DATA_COOKIE);

  ch = curl_easy_init();
  if(!ch)
    goto cleanup;

  curl_easy_setopt(ch, CURLOPT_SHARE, sh);
  curl_easy_setopt(ch, CURLOPT_URL, URL);
  curl_easy_setopt(ch, CURLOPT_COOKIEFILE, "log/cookies1905");
  curl_easy_setopt(ch, CURLOPT_COOKIEJAR, "log/cookies1905");

  curl_multi_add_handle(cm, ch);

  unfinished = 1;
  while(unfinished) {
    int MAX = 0;
    long max_tout;
    fd_set R, W, E;
    struct timeval timeout;

    FD_ZERO(&R);
    FD_ZERO(&W);
    FD_ZERO(&E);
    curl_multi_perform(cm, &unfinished);

    curl_multi_fdset(cm, &R, &W, &E, &MAX);
    curl_multi_timeout(cm, &max_tout);

    if(max_tout > 0) {
      timeout.tv_sec = max_tout / 1000;
      timeout.tv_usec = (max_tout % 1000) * 1000;
    }
    else {
      timeout.tv_sec = 0;
      timeout.tv_usec = 1000;
    }

    select(MAX + 1, &R, &W, &E, &timeout);
  }

  curl_easy_setopt(ch, CURLOPT_COOKIELIST, "FLUSH");
  curl_easy_setopt(ch, CURLOPT_SHARE, NULL);

  curl_multi_remove_handle(cm, ch);
  cleanup:
  curl_easy_cleanup(ch);
  curl_share_cleanup(sh);
  curl_multi_cleanup(cm);
  curl_global_cleanup();

  return 0;
}